

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void assembler(istream *input,ostream *output)

{
  unsigned_long wtr;
  Error err;
  undefined1 local_2c0 [8];
  Assembler ab;
  undefined1 local_210 [8];
  Analyser as;
  undefined1 local_50 [8];
  Tokenizer tkz;
  ostream *output_local;
  istream *input_local;
  
  tkz._ptr.second = (unsigned_long)output;
  Tokenizer::Tokenizer((Tokenizer *)local_50,input);
  Tokenizer::Tokenize((vector<Token,_std::allocator<Token>_> *)
                      &ab._functionParameter._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      (Tokenizer *)local_50);
  Analyser::Analyser((Analyser *)local_210,
                     (vector<Token,_std::allocator<Token>_> *)
                     &ab._functionParameter._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::vector<Token,_std::allocator<Token>_>::~vector
            ((vector<Token,_std::allocator<Token>_> *)
             &ab._functionParameter._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Analyser::Analyse((Analyser *)local_210);
  wtr = tkz._ptr.second;
  Analyser::Analyser((Analyser *)&err._lineNumber,(Analyser *)local_210);
  Assembler::Assembler((Assembler *)local_2c0,(ostream *)wtr,(Analyser *)&err._lineNumber);
  Analyser::~Analyser((Analyser *)&err._lineNumber);
  Assembler::Assemble((Assembler *)local_2c0);
  Assembler::~Assembler((Assembler *)local_2c0);
  Analyser::~Analyser((Analyser *)local_210);
  Tokenizer::~Tokenizer((Tokenizer *)local_50);
  return;
}

Assistant:

void assembler(std::istream& input, std::ostream& output) {
	try {
		Tokenizer tkz(input);
		Analyser as(tkz.Tokenize());
		as.Analyse();
		Assembler ab(output, as);
		ab.Assemble();
	}
	catch (Error err) {
		err.printErrorMessage();
	}
}